

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint64 ma_dr_wav_write_pcm_frames_le(ma_dr_wav *pWav,ma_uint64 framesToWrite,void *pData)

{
  ma_dr_wav *in_RDX;
  long in_RSI;
  long in_RDI;
  ma_uint64 bytesToWriteThisIteration;
  size_t bytesJustWritten;
  ma_uint8 *pRunningData;
  ma_uint64 bytesWritten;
  ma_uint64 bytesToWrite;
  size_t in_stack_ffffffffffffffc0;
  long local_30;
  void *local_28;
  ulong local_8;
  
  if (((in_RDI == 0) || (in_RSI == 0)) || (in_RDX == (ma_dr_wav *)0x0)) {
    local_8 = 0;
  }
  else {
    local_28 = (void *)(in_RSI * (ulong)*(ushort *)(in_RDI + 0x70) *
                        (ulong)*(ushort *)(in_RDI + 0x72) >> 3);
    local_30 = 0;
    while ((local_28 != (void *)0x0 &&
           (in_stack_ffffffffffffffc0 =
                 ma_dr_wav_write_raw(in_RDX,in_stack_ffffffffffffffc0,local_28),
           in_stack_ffffffffffffffc0 != 0))) {
      local_28 = (void *)((long)local_28 - in_stack_ffffffffffffffc0);
      local_30 = in_stack_ffffffffffffffc0 + local_30;
      in_RDX = (ma_dr_wav *)((in_RDX->fmt).subFormat + (in_stack_ffffffffffffffc0 - 0x5c));
    }
    local_8 = ((ulong)(local_30 << 3) / (ulong)*(ushort *)(in_RDI + 0x72)) /
              (ulong)*(ushort *)(in_RDI + 0x70);
  }
  return local_8;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_write_pcm_frames_le(ma_dr_wav* pWav, ma_uint64 framesToWrite, const void* pData)
{
    ma_uint64 bytesToWrite;
    ma_uint64 bytesWritten;
    const ma_uint8* pRunningData;
    if (pWav == NULL || framesToWrite == 0 || pData == NULL) {
        return 0;
    }
    bytesToWrite = ((framesToWrite * pWav->channels * pWav->bitsPerSample) / 8);
    if (bytesToWrite > MA_SIZE_MAX) {
        return 0;
    }
    bytesWritten = 0;
    pRunningData = (const ma_uint8*)pData;
    while (bytesToWrite > 0) {
        size_t bytesJustWritten;
        ma_uint64 bytesToWriteThisIteration;
        bytesToWriteThisIteration = bytesToWrite;
        MA_DR_WAV_ASSERT(bytesToWriteThisIteration <= MA_SIZE_MAX);
        bytesJustWritten = ma_dr_wav_write_raw(pWav, (size_t)bytesToWriteThisIteration, pRunningData);
        if (bytesJustWritten == 0) {
            break;
        }
        bytesToWrite -= bytesJustWritten;
        bytesWritten += bytesJustWritten;
        pRunningData += bytesJustWritten;
    }
    return (bytesWritten * 8) / pWav->bitsPerSample / pWav->channels;
}